

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

_Bool background_thread_create_locked(tsd_t *tsd,uint arena_ind)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int8_t *piVar3;
  rtree_ctx_cache_elm_t *prVar4;
  tsd_t *tsd_00;
  background_thread_info_t *pbVar5;
  int iVar6;
  uint uVar7;
  void *arg;
  pthread_attr_t *attr;
  _func_void_ptr_void_ptr *extraout_RDX;
  _func_void_ptr_void_ptr *extraout_RDX_00;
  _func_void_ptr_void_ptr *start_routine;
  pthread_mutex_t *__mutex;
  _Bool _Var8;
  undefined4 in_register_00000034;
  background_thread_info_t *pbVar9;
  mutex_prof_data_t *data;
  rtree_ctx_cache_elm_t *prVar10;
  
  pbVar9 = (background_thread_info_t *)CONCAT44(in_register_00000034,arena_ind);
  attr = (pthread_attr_t *)((ulong)arena_ind % max_background_threads);
  arg = (void *)((long)attr * 0xd0);
  tsd_00 = (tsd_t *)(background_thread_info + (long)attr);
  pbVar5 = background_thread_info + (long)attr;
  __mutex = (pthread_mutex_t *)((long)&background_thread_info[(long)attr].mtx.field_0 + 0x40);
  iVar6 = pthread_mutex_trylock(__mutex);
  if (iVar6 != 0) {
    malloc_mutex_lock_slow(&pbVar5->mtx);
    *(undefined1 *)
     &(tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[7].leafkey = 1
    ;
  }
  prVar10 = (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache + 4;
  prVar10->leafkey = prVar10->leafkey + 1;
  if ((tsd_t *)(tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[3].
               leaf != tsd) {
    (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[3].leaf =
         (rtree_leaf_elm_t *)tsd;
    prVar10 = (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache + 3;
    prVar10->leafkey = prVar10->leafkey + 1;
  }
  if (((background_thread_enabled_state.repr & 1U) == 0) ||
     (*(int *)&(tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[7].
               leaf != 0)) {
    prVar10 = (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache + 7;
    _Var8 = false;
  }
  else {
    background_thread_init(tsd_00,pbVar9);
    *(undefined1 *)
     &(tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[7].leafkey = 0
    ;
    pthread_mutex_unlock(__mutex);
    pbVar9 = background_thread_info;
    if (arena_ind == 0) {
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
      start_routine = extraout_RDX;
      if ((tsd->state).repr == '\0') {
        tsd_slow_update(tsd);
        start_routine = extraout_RDX_00;
      }
      uVar7 = background_thread_create_signals_masked((pthread_t *)tsd_00,attr,start_routine,arg);
      piVar3 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == '\0') {
        tsd_slow_update(tsd);
      }
      if (uVar7 == 0) {
        return false;
      }
      prVar10 = (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache + 7;
      malloc_printf("<jemalloc>: arena 0 background thread creation failed (%d)\n",(ulong)uVar7);
      iVar6 = pthread_mutex_trylock(__mutex);
      if (iVar6 != 0) {
        malloc_mutex_lock_slow(&pbVar5->mtx);
        *(undefined1 *)&prVar10->leafkey = 1;
      }
      prVar4 = (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache + 4;
      prVar4->leafkey = prVar4->leafkey + 1;
      if ((tsd_t *)(tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                   [3].leaf != tsd) {
        (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[3].leaf =
             (rtree_leaf_elm_t *)tsd;
        prVar4 = (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache + 3
        ;
        prVar4->leafkey = prVar4->leafkey + 1;
      }
      *(undefined4 *)
       &(tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[7].leaf = 0;
      n_background_threads = n_background_threads - 1;
      _Var8 = true;
    }
    else {
      __mutex = (pthread_mutex_t *)((long)&(background_thread_info->mtx).field_0 + 0x40);
      iVar6 = pthread_mutex_trylock(__mutex);
      if (iVar6 != 0) {
        malloc_mutex_lock_slow(&pbVar9->mtx);
        (pbVar9->mtx).field_0.field_0.locked.repr = true;
      }
      puVar1 = &(pbVar9->mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if (&((pbVar9->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        (pbVar9->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
        ppwVar2 = &(pbVar9->mtx).field_0.witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      pthread_cond_signal((pthread_cond_t *)&pbVar9->cond);
      prVar10 = (rtree_ctx_cache_elm_t *)&(pbVar9->mtx).field_0.field_0.locked;
      _Var8 = false;
    }
  }
  *(undefined1 *)&prVar10->leafkey = 0;
  pthread_mutex_unlock(__mutex);
  return _Var8;
}

Assistant:

static bool
background_thread_create_locked(tsd_t *tsd, unsigned arena_ind) {
	assert(have_background_thread);
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);

	/* We create at most NCPUs threads. */
	size_t thread_ind = arena_ind % max_background_threads;
	background_thread_info_t *info = &background_thread_info[thread_ind];

	bool need_new_thread;
	malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	need_new_thread = background_thread_enabled() &&
	    (info->state == background_thread_stopped);
	if (need_new_thread) {
		background_thread_init(tsd, info);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
	if (!need_new_thread) {
		return false;
	}
	if (arena_ind != 0) {
		/* Threads are created asynchronously by Thread 0. */
		background_thread_info_t *t0 = &background_thread_info[0];
		malloc_mutex_lock(tsd_tsdn(tsd), &t0->mtx);
		assert(t0->state == background_thread_started);
		pthread_cond_signal(&t0->cond);
		malloc_mutex_unlock(tsd_tsdn(tsd), &t0->mtx);

		return false;
	}

	pre_reentrancy(tsd, NULL);
	/*
	 * To avoid complications (besides reentrancy), create internal
	 * background threads with the underlying pthread_create.
	 */
	int err = background_thread_create_signals_masked(&info->thread, NULL,
	    background_thread_entry, (void *)thread_ind);
	post_reentrancy(tsd);

	if (err != 0) {
		malloc_printf("<jemalloc>: arena 0 background thread creation "
		    "failed (%d)\n", err);
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
		info->state = background_thread_stopped;
		n_background_threads--;
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);

		return true;
	}

	return false;
}